

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

void __thiscall
slang::ast::DiagnosticVisitor::DiagnosticVisitor
          (DiagnosticVisitor *this,Compilation *compilation,size_t *numErrors,uint32_t errorLimit)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  unordered_flat_map<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  *in_stack_ffffffffffffffb0;
  unordered_flat_map<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>_>_>
  *this_00;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  *(undefined4 *)(in_RDI + 2) = in_ECX;
  *(undefined1 *)((long)in_RDI + 0x14) = 1;
  *(undefined1 *)((long)in_RDI + 0x15) = 0;
  *(undefined1 *)((long)in_RDI + 0x16) = 0;
  boost::unordered::
  unordered_flat_map<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  ::unordered_flat_map(in_stack_ffffffffffffffb0);
  boost::unordered::
  unordered_flat_set<const_slang::ast::InstanceBodySymbol_*,_slang::hash<const_slang::ast::InstanceBodySymbol_*,_void>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
  ::unordered_flat_set
            ((unordered_flat_set<const_slang::ast::InstanceBodySymbol_*,_slang::hash<const_slang::ast::InstanceBodySymbol_*,_void>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
              *)in_stack_ffffffffffffffb0);
  this_00 = (unordered_flat_map<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>_>_>
             *)(in_RDI + 0xf);
  boost::unordered::
  unordered_flat_set<const_slang::ast::DefinitionSymbol_*,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ::unordered_flat_set
            ((unordered_flat_set<const_slang::ast::DefinitionSymbol_*,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
              *)this_00);
  SmallVector<const_slang::ast::GenericClassDefSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::GenericClassDefSymbol_*,_5UL> *)0x8cfe03);
  SmallVector<const_slang::ast::SubroutineSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::SubroutineSymbol_*,_5UL> *)0x8cfe19);
  SmallVector<const_slang::ast::MethodPrototypeSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::MethodPrototypeSymbol_*,_5UL> *)0x8cfe2f);
  SmallVector<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_2UL>
  ::SmallVector((SmallVector<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_2UL>
                 *)0x8cfe45);
  boost::unordered::
  unordered_flat_map<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>_>_>
  ::unordered_flat_map(this_00);
  return;
}

Assistant:

DiagnosticVisitor(Compilation& compilation, const size_t& numErrors, uint32_t errorLimit) :
        compilation(compilation), numErrors(numErrors), errorLimit(errorLimit) {}